

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O2

uint SOIL_internal_create_OGL_texture
               (uchar *data,int width,int height,int channels,uint reuse_texture_ID,uint flags,
               uint opengl_texture_type,uint opengl_texture_target,uint texture_check_size_enum)

{
  byte bVar1;
  uchar uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  long lVar8;
  int iVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  undefined8 uVar14;
  uchar *puVar15;
  undefined4 uVar16;
  ulong uVar17;
  GLenum local_84;
  uchar *local_80;
  GLenum local_78;
  uint local_74;
  int DDS_size;
  ulong local_60;
  uchar *local_58;
  uint tex_id;
  uint local_48;
  int max_supported_size;
  ulong local_40;
  undefined4 local_38;
  int local_34;
  
  uVar17 = (ulong)(uint)height;
  local_78 = opengl_texture_target;
  if ((flags >> 9 & 1) == 0) {
    local_58 = (uchar *)CONCAT44(local_58._4_4_,reuse_texture_ID);
    local_74 = flags;
  }
  else {
    iVar11 = query_tex_rectangle_capability();
    if (iVar11 != 1) {
      result_string_pointer = "Texture Rectangle extension unsupported";
      return 0;
    }
    local_58 = (uchar *)CONCAT44(local_58._4_4_,reuse_texture_ID);
    if (opengl_texture_type == 0xde1) {
      local_74 = flags & 0xfffffff8;
      local_78 = 0x84f5;
      opengl_texture_type = 0x84f5;
    }
    else {
      local_74 = flags & 0xfffffdff;
    }
  }
  iVar11 = channels * width;
  puVar7 = (uchar *)malloc((long)(iVar11 * height));
  memcpy(puVar7,data,(long)(iVar11 * height));
  if ((local_74 & 0x10) != 0) {
    iVar12 = (height + -1) * iVar11;
    iVar6 = 0;
    for (iVar9 = 0; iVar9 * 2 < height; iVar9 = iVar9 + 1) {
      puVar15 = puVar7;
      for (iVar5 = iVar11; 0 < iVar5; iVar5 = iVar5 + -1) {
        uVar2 = puVar15[iVar6];
        puVar15[iVar6] = puVar15[iVar12];
        puVar15[iVar12] = uVar2;
        puVar15 = puVar15 + 1;
      }
      iVar6 = iVar6 + iVar11;
      iVar12 = iVar12 - iVar11;
    }
  }
  if ((char)local_74 < '\0') {
    scale_image_RGB_to_NTSC_safe(puVar7,width,height,channels);
  }
  if ((local_74 & 8) != 0) {
    if (channels == 2) {
      for (lVar8 = 0; lVar8 < width * height * 2; lVar8 = lVar8 + 2) {
        puVar7[lVar8] = (uchar)((uint)puVar7[lVar8 + 1] * (uint)puVar7[lVar8] + 0x80 >> 8);
      }
    }
    else if (channels == 4) {
      for (lVar8 = 0; lVar8 < width * height * 4; lVar8 = lVar8 + 4) {
        bVar1 = puVar7[lVar8 + 3];
        puVar7[lVar8] = (uchar)((uint)puVar7[lVar8] * (uint)bVar1 + 0x80 >> 8);
        puVar7[lVar8 + 1] = (uchar)((uint)puVar7[lVar8 + 1] * (uint)bVar1 + 0x80 >> 8);
        puVar7[lVar8 + 2] = (uchar)((uint)puVar7[lVar8 + 2] * (uint)bVar1 + 0x80 >> 8);
      }
    }
  }
  local_48 = opengl_texture_type;
  iVar11 = query_NPOT_capability();
  glGetIntegerv(texture_check_size_enum,&max_supported_size);
  if (((local_74 & 3) != 0 || (local_74 & 0x200) == 0 && iVar11 == 0) ||
     (max_supported_size < width || max_supported_size < height)) {
    iVar11 = 1;
    do {
      iVar12 = iVar11;
      iVar11 = iVar12 * 2;
    } while (iVar12 < width);
    uVar3 = 1;
    do {
      uVar13 = uVar3;
      iVar11 = (int)uVar13;
      uVar3 = (ulong)(uint)(iVar11 * 2);
    } while (iVar11 < height);
    if (iVar11 != height || iVar12 != width) {
      local_80 = (uchar *)malloc((long)(iVar12 * channels * iVar11));
      up_scale_image(puVar7,width,height,channels,local_80,iVar12,iVar11);
      free(puVar7);
      goto LAB_00147244;
    }
  }
  uVar13 = (ulong)(uint)height;
  local_80 = puVar7;
  iVar12 = width;
LAB_00147244:
  iVar6 = (int)uVar13;
  iVar11 = iVar12;
  if (max_supported_size < iVar12 || max_supported_size < iVar6) {
    uVar17 = 1;
    iVar9 = 1;
    if (max_supported_size < iVar12) {
      iVar9 = iVar12 / max_supported_size;
    }
    if (max_supported_size < iVar6) {
      uVar17 = (long)iVar6 / (long)max_supported_size & 0xffffffff;
    }
    iVar11 = iVar12 / iVar9;
    iVar5 = iVar6 / (int)uVar17;
    local_40 = CONCAT44(local_40._4_4_,iVar5);
    puVar7 = (uchar *)malloc((long)(iVar11 * channels * iVar5));
    mipmap_image(local_80,iVar12,iVar6,channels,puVar7,iVar9,(int)uVar17);
    free(local_80);
    uVar13 = local_40 & 0xffffffff;
    local_80 = puVar7;
  }
  iVar12 = (int)uVar13;
  if ((local_74 >> 8 & 1) != 0) {
    convert_RGB_to_YCoCg(local_80,iVar11,iVar12,channels);
  }
  tex_id = (uint)local_58;
  if (((uint)local_58 == 0) && (glGenTextures(1,&tex_id), tex_id == 0)) {
    result_string_pointer = "Failed to generate an OpenGL texture name; missing OpenGL context?";
  }
  else {
    local_60 = 0;
    if (channels - 1U < 4) {
      local_60 = (ulong)*(uint *)(&DAT_001830bc + (ulong)(channels - 1U) * 4);
    }
    if (((local_74 & 0x20) == 0) || (iVar6 = query_DXT_capability(), iVar6 != 1)) {
      uVar16 = 0;
      local_84 = (GLenum)local_60;
    }
    else {
      local_84 = (uint)((channels & 1U) == 0) * 3 + 0x83f0;
      uVar16 = (undefined4)CONCAT71((int7)(uVar17 >> 8),1);
    }
    glBindTexture(local_48,tex_id);
    local_40 = uVar13;
    if ((char)uVar16 == '\0') {
      glTexImage2D(local_78,0,local_84,iVar11,uVar13,0,local_60,0x1401,local_80);
    }
    else {
      if ((channels & 1U) == 0) {
        puVar7 = convert_image_to_DXT5(local_80,iVar11,iVar12,channels,&DDS_size);
      }
      else {
        puVar7 = convert_image_to_DXT1(local_80,iVar11,iVar12,channels,&DDS_size);
      }
      if (puVar7 == (uchar *)0x0) {
        glTexImage2D(local_78,0,local_84,iVar11,uVar13,0,local_60,0x1401,local_80);
      }
      else {
        (*soilGlCompressedTexImage2D)(local_78,0,local_84,iVar11,iVar12,0,DDS_size,puVar7);
        free(puVar7);
      }
    }
    uVar14 = 0x2601;
    if ((local_74 & 2) != 0) {
      iVar12 = 1;
      uVar17 = (long)(iVar11 + 1) / 2;
      iVar6 = (int)local_40;
      uVar3 = (long)(iVar6 + 1) / 2;
      local_38 = uVar16;
      local_58 = (uchar *)malloc((long)((int)uVar3 * channels * (int)uVar17));
      local_34 = iVar6;
      if (iVar6 < iVar11) {
        local_34 = iVar11;
      }
      while( true ) {
        puVar7 = local_58;
        iVar6 = 1 << ((byte)iVar12 & 0x1f);
        if (local_34 < iVar6) break;
        mipmap_image(local_80,iVar11,(int)local_40,channels,local_58,iVar6,iVar6);
        iVar6 = (int)uVar17;
        iVar9 = (int)uVar3;
        if ((char)local_38 == '\0') {
          glTexImage2D(local_78,iVar12,local_84,uVar17 & 0xffffffff,uVar3 & 0xffffffff,0,local_60,
                       0x1401,puVar7);
        }
        else {
          if ((channels & 1U) == 0) {
            puVar7 = convert_image_to_DXT5(local_58,iVar6,iVar9,channels,&DDS_size);
          }
          else {
            puVar7 = convert_image_to_DXT1(local_58,iVar6,iVar9,channels,&DDS_size);
          }
          if (puVar7 == (uchar *)0x0) {
            glTexImage2D(local_78,iVar12,local_84,uVar17 & 0xffffffff,uVar3 & 0xffffffff,0,local_60,
                         0x1401,local_58);
          }
          else {
            (*soilGlCompressedTexImage2D)(local_78,iVar12,local_84,iVar6,iVar9,0,DDS_size,puVar7);
            free(puVar7);
          }
        }
        iVar12 = iVar12 + 1;
        uVar17 = (long)(iVar6 + 1) / 2;
        uVar3 = (long)(iVar9 + 1) / 2;
      }
      free(local_58);
      uVar14 = 0x2703;
    }
    uVar4 = local_48;
    glTexParameteri(local_48,0x2800,0x2601);
    glTexParameteri(uVar4,0x2801,uVar14);
    if ((local_74 & 4) == 0) {
      uVar10 = 0x2900;
      glTexParameteri(uVar4,0x2802,0x2900);
      uVar14 = 0x2900;
    }
    else {
      uVar10 = 0x2901;
      glTexParameteri(uVar4,0x2802,0x2901);
      uVar14 = 0x2901;
    }
    glTexParameteri(uVar4,0x2803,uVar14);
    if (uVar4 == 0x8513) {
      glTexParameteri(0x8513,0x8072,uVar10);
    }
    result_string_pointer = "Image loaded as an OpenGL texture";
  }
  free(local_80);
  return tex_id;
}

Assistant:

unsigned int
	SOIL_internal_create_OGL_texture
	(
		const unsigned char *const data,
		int width, int height, int channels,
		unsigned int reuse_texture_ID,
		unsigned int flags,
		unsigned int opengl_texture_type,
		unsigned int opengl_texture_target,
		unsigned int texture_check_size_enum
	)
{
	/*	variables	*/
	unsigned char* img;
	unsigned int tex_id;
	unsigned int internal_texture_format = 0, original_texture_format = 0;
	int DXT_mode = SOIL_CAPABILITY_UNKNOWN;
	int max_supported_size;
	/*	If the user wants to use the texture rectangle I kill a few flags	*/
	if( flags & SOIL_FLAG_TEXTURE_RECTANGLE )
	{
		/*	well, the user asked for it, can we do that?	*/
		if( query_tex_rectangle_capability() == SOIL_CAPABILITY_PRESENT )
		{
			/*	only allow this if the user in _NOT_ trying to do a cubemap!	*/
			if( opengl_texture_type == GL_TEXTURE_2D )
			{
				/*	clean out the flags that cannot be used with texture rectangles	*/
				flags &= ~(
						SOIL_FLAG_POWER_OF_TWO | SOIL_FLAG_MIPMAPS |
						SOIL_FLAG_TEXTURE_REPEATS
					);
				/*	and change my target	*/
				opengl_texture_target = SOIL_TEXTURE_RECTANGLE_ARB;
				opengl_texture_type = SOIL_TEXTURE_RECTANGLE_ARB;
			} else
			{
				/*	not allowed for any other uses (yes, I'm looking at you, cubemaps!)	*/
				flags &= ~SOIL_FLAG_TEXTURE_RECTANGLE;
			}

		} else
		{
			/*	can't do it, and that is a breakable offense (uv coords use pixels instead of [0,1]!)	*/
			result_string_pointer = "Texture Rectangle extension unsupported";
			return 0;
		}
	}
	/*	create a copy the image data	*/
	img = (unsigned char*)malloc( width*height*channels );
	memcpy( img, data, width*height*channels );
	/*	does the user want me to invert the image?	*/
	if( flags & SOIL_FLAG_INVERT_Y )
	{
		int i, j;
		for( j = 0; j*2 < height; ++j )
		{
			int index1 = j * width * channels;
			int index2 = (height - 1 - j) * width * channels;
			for( i = width * channels; i > 0; --i )
			{
				unsigned char temp = img[index1];
				img[index1] = img[index2];
				img[index2] = temp;
				++index1;
				++index2;
			}
		}
	}
	/*	does the user want me to scale the colors into the NTSC safe RGB range?	*/
	if( flags & SOIL_FLAG_NTSC_SAFE_RGB )
	{
		scale_image_RGB_to_NTSC_safe( img, width, height, channels );
	}
	/*	does the user want me to convert from straight to pre-multiplied alpha?
		(and do we even _have_ alpha?)	*/
	if( flags & SOIL_FLAG_MULTIPLY_ALPHA )
	{
		int i;
		switch( channels )
		{
		case 2:
			for( i = 0; i < 2*width*height; i += 2 )
			{
				img[i] = (img[i] * img[i+1] + 128) >> 8;
			}
			break;
		case 4:
			for( i = 0; i < 4*width*height; i += 4 )
			{
				img[i+0] = (img[i+0] * img[i+3] + 128) >> 8;
				img[i+1] = (img[i+1] * img[i+3] + 128) >> 8;
				img[i+2] = (img[i+2] * img[i+3] + 128) >> 8;
			}
			break;
		default:
			/*	no other number of channels contains alpha data	*/
			break;
		}
	}
	/*	if the user can't support NPOT textures, make sure we force the POT option	*/
	if( (query_NPOT_capability() == SOIL_CAPABILITY_NONE) &&
		!(flags & SOIL_FLAG_TEXTURE_RECTANGLE) )
	{
		/*	add in the POT flag */
		flags |= SOIL_FLAG_POWER_OF_TWO;
	}
	/*	how large of a texture can this OpenGL implementation handle?	*/
	/*	texture_check_size_enum will be GL_MAX_TEXTURE_SIZE or SOIL_MAX_CUBE_MAP_TEXTURE_SIZE	*/
	glGetIntegerv( texture_check_size_enum, &max_supported_size );
	/*	do I need to make it a power of 2?	*/
	if(
		(flags & SOIL_FLAG_POWER_OF_TWO) ||	/*	user asked for it	*/
		(flags & SOIL_FLAG_MIPMAPS) ||		/*	need it for the MIP-maps	*/
		(width > max_supported_size) ||		/*	it's too big, (make sure it's	*/
		(height > max_supported_size) )		/*	2^n for later down-sampling)	*/
	{
		int new_width = 1;
		int new_height = 1;
		while( new_width < width )
		{
			new_width *= 2;
		}
		while( new_height < height )
		{
			new_height *= 2;
		}
		/*	still?	*/
		if( (new_width != width) || (new_height != height) )
		{
			/*	yep, resize	*/
			unsigned char *resampled = (unsigned char*)malloc( channels*new_width*new_height );
			up_scale_image(
					img, width, height, channels,
					resampled, new_width, new_height );
			/*	OJO	this is for debug only!	*/
			/*
			SOIL_save_image( "\\showme.bmp", SOIL_SAVE_TYPE_BMP,
							new_width, new_height, channels,
							resampled );
			*/
			/*	nuke the old guy, then point it at the new guy	*/
			SOIL_free_image_data( img );
			img = resampled;
			width = new_width;
			height = new_height;
		}
	}
	/*	now, if it is too large...	*/
	if( (width > max_supported_size) || (height > max_supported_size) )
	{
		/*	I've already made it a power of two, so simply use the MIPmapping
			code to reduce its size to the allowable maximum.	*/
		unsigned char *resampled;
		int reduce_block_x = 1, reduce_block_y = 1;
		int new_width, new_height;
		if( width > max_supported_size )
		{
			reduce_block_x = width / max_supported_size;
		}
		if( height > max_supported_size )
		{
			reduce_block_y = height / max_supported_size;
		}
		new_width = width / reduce_block_x;
		new_height = height / reduce_block_y;
		resampled = (unsigned char*)malloc( channels*new_width*new_height );
		/*	perform the actual reduction	*/
		mipmap_image(	img, width, height, channels,
						resampled, reduce_block_x, reduce_block_y );
		/*	nuke the old guy, then point it at the new guy	*/
		SOIL_free_image_data( img );
		img = resampled;
		width = new_width;
		height = new_height;
	}
	/*	does the user want us to use YCoCg color space?	*/
	if( flags & SOIL_FLAG_CoCg_Y )
	{
		/*	this will only work with RGB and RGBA images */
		convert_RGB_to_YCoCg( img, width, height, channels );
		/*
		save_image_as_DDS( "CoCg_Y.dds", width, height, channels, img );
		*/
	}
	/*	create the OpenGL texture ID handle
    	(note: allowing a forced texture ID lets me reload a texture)	*/
    tex_id = reuse_texture_ID;
    if( tex_id == 0 )
    {
		glGenTextures( 1, &tex_id );
    }
	check_for_GL_errors( "glGenTextures" );
	/* Note: sometimes glGenTextures fails (usually no OpenGL context)	*/
	if( tex_id )
	{
		/*	and what type am I using as the internal texture format?	*/
		switch( channels )
		{
		case 1:
			original_texture_format = GL_LUMINANCE;
			break;
		case 2:
			original_texture_format = GL_LUMINANCE_ALPHA;
			break;
		case 3:
			original_texture_format = GL_RGB;
			break;
		case 4:
			original_texture_format = GL_RGBA;
			break;
		}
		internal_texture_format = original_texture_format;
		/*	does the user want me to, and can I, save as DXT?	*/
		if( flags & SOIL_FLAG_COMPRESS_TO_DXT )
		{
			DXT_mode = query_DXT_capability();
			if( DXT_mode == SOIL_CAPABILITY_PRESENT )
			{
				/*	I can use DXT, whether I compress it or OpenGL does	*/
				if( (channels & 1) == 1 )
				{
					/*	1 or 3 channels = DXT1	*/
					internal_texture_format = SOIL_RGB_S3TC_DXT1;
				} else
				{
					/*	2 or 4 channels = DXT5	*/
					internal_texture_format = SOIL_RGBA_S3TC_DXT5;
				}
			}
		}
		/*  bind an OpenGL texture ID	*/
		glBindTexture( opengl_texture_type, tex_id );
		check_for_GL_errors( "glBindTexture" );
		/*  upload the main image	*/
		if( DXT_mode == SOIL_CAPABILITY_PRESENT )
		{
			/*	user wants me to do the DXT conversion!	*/
			int DDS_size;
			unsigned char *DDS_data = NULL;
			if( (channels & 1) == 1 )
			{
				/*	RGB, use DXT1	*/
				DDS_data = convert_image_to_DXT1( img, width, height, channels, &DDS_size );
			} else
			{
				/*	RGBA, use DXT5	*/
				DDS_data = convert_image_to_DXT5( img, width, height, channels, &DDS_size );
			}
			if( DDS_data )
			{
				soilGlCompressedTexImage2D(
					opengl_texture_target, 0,
					internal_texture_format, width, height, 0,
					DDS_size, DDS_data );
				check_for_GL_errors( "glCompressedTexImage2D" );
				SOIL_free_image_data( DDS_data );
				/*	printf( "Internal DXT compressor\n" );	*/
			} else
			{
				/*	my compression failed, try the OpenGL driver's version	*/
				glTexImage2D(
					opengl_texture_target, 0,
					internal_texture_format, width, height, 0,
					original_texture_format, GL_UNSIGNED_BYTE, img );
				check_for_GL_errors( "glTexImage2D" );
				/*	printf( "OpenGL DXT compressor\n" );	*/
			}
		} else
		{
			/*	user want OpenGL to do all the work!	*/
			glTexImage2D(
				opengl_texture_target, 0,
				internal_texture_format, width, height, 0,
				original_texture_format, GL_UNSIGNED_BYTE, img );
			check_for_GL_errors( "glTexImage2D" );
			/*printf( "OpenGL DXT compressor\n" );	*/
		}
		/*	are any MIPmaps desired?	*/
		if( flags & SOIL_FLAG_MIPMAPS )
		{
			int MIPlevel = 1;
			int MIPwidth = (width+1) / 2;
			int MIPheight = (height+1) / 2;
			unsigned char *resampled = (unsigned char*)malloc( channels*MIPwidth*MIPheight );
			while( ((1<<MIPlevel) <= width) || ((1<<MIPlevel) <= height) )
			{
				/*	do this MIPmap level	*/
				mipmap_image(
						img, width, height, channels,
						resampled,
						(1 << MIPlevel), (1 << MIPlevel) );
				/*  upload the MIPmaps	*/
				if( DXT_mode == SOIL_CAPABILITY_PRESENT )
				{
					/*	user wants me to do the DXT conversion!	*/
					int DDS_size;
					unsigned char *DDS_data = NULL;
					if( (channels & 1) == 1 )
					{
						/*	RGB, use DXT1	*/
						DDS_data = convert_image_to_DXT1(
								resampled, MIPwidth, MIPheight, channels, &DDS_size );
					} else
					{
						/*	RGBA, use DXT5	*/
						DDS_data = convert_image_to_DXT5(
								resampled, MIPwidth, MIPheight, channels, &DDS_size );
					}
					if( DDS_data )
					{
						soilGlCompressedTexImage2D(
							opengl_texture_target, MIPlevel,
							internal_texture_format, MIPwidth, MIPheight, 0,
							DDS_size, DDS_data );
						check_for_GL_errors( "glCompressedTexImage2D" );
						SOIL_free_image_data( DDS_data );
					} else
					{
						/*	my compression failed, try the OpenGL driver's version	*/
						glTexImage2D(
							opengl_texture_target, MIPlevel,
							internal_texture_format, MIPwidth, MIPheight, 0,
							original_texture_format, GL_UNSIGNED_BYTE, resampled );
						check_for_GL_errors( "glTexImage2D" );
					}
				} else
				{
					/*	user want OpenGL to do all the work!	*/
					glTexImage2D(
						opengl_texture_target, MIPlevel,
						internal_texture_format, MIPwidth, MIPheight, 0,
						original_texture_format, GL_UNSIGNED_BYTE, resampled );
					check_for_GL_errors( "glTexImage2D" );
				}
				/*	prep for the next level	*/
				++MIPlevel;
				MIPwidth = (MIPwidth + 1) / 2;
				MIPheight = (MIPheight + 1) / 2;
			}
			SOIL_free_image_data( resampled );
			/*	instruct OpenGL to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR );
			check_for_GL_errors( "GL_TEXTURE_MIN/MAG_FILTER" );
		} else
		{
			/*	instruct OpenGL _NOT_ to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR );
			check_for_GL_errors( "GL_TEXTURE_MIN/MAG_FILTER" );
		}
		/*	does the user want clamping, or wrapping?	*/
		if( flags & SOIL_FLAG_TEXTURE_REPEATS )
		{
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, GL_REPEAT );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, GL_REPEAT );
			if( opengl_texture_type == SOIL_TEXTURE_CUBE_MAP )
			{
				/*	SOIL_TEXTURE_WRAP_R is invalid if cubemaps aren't supported	*/
				glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, GL_REPEAT );
			}
			check_for_GL_errors( "GL_TEXTURE_WRAP_*" );
		} else
		{
			/*	unsigned int clamp_mode = SOIL_CLAMP_TO_EDGE;	*/
			unsigned int clamp_mode = GL_CLAMP;
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, clamp_mode );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, clamp_mode );
			if( opengl_texture_type == SOIL_TEXTURE_CUBE_MAP )
			{
				/*	SOIL_TEXTURE_WRAP_R is invalid if cubemaps aren't supported	*/
				glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, clamp_mode );
			}
			check_for_GL_errors( "GL_TEXTURE_WRAP_*" );
		}
		/*	done	*/
		result_string_pointer = "Image loaded as an OpenGL texture";
	} else
	{
		/*	failed	*/
		result_string_pointer = "Failed to generate an OpenGL texture name; missing OpenGL context?";
	}
	SOIL_free_image_data( img );
	return tex_id;
}